

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O1

void __thiscall CHuffman::ConstructTree(CHuffman *this,uint *pFrequencies)

{
  long lVar1;
  long lVar2;
  long lVar3;
  CHuffmanConstructNode *pCVar4;
  CHuffmanConstructNode *pCVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  int i;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  CHuffmanConstructNode *apCStack_1048 [2];
  CHuffmanConstructNode *apNodesLeft [257];
  undefined1 auStack_82e [6];
  CHuffmanConstructNode aNodesLeftStorage [257];
  
  apNodesLeft[5] = (CHuffmanConstructNode *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = 6;
  lVar9 = 0;
  do {
    *(undefined8 *)(this->m_aNodes[0].m_aLeafs + lVar7 + -8) = 0xffffffffffffffff;
    *(char *)(this->m_aNodes[0].m_aLeafs + lVar7 + -4) = (char)lVar9;
    uVar11 = 1;
    if (lVar9 != 0x100) {
      uVar11 = pFrequencies[lVar9];
    }
    aNodesLeftStorage[lVar9].m_Frequency = uVar11;
    aNodesLeftStorage[lVar9].m_NodeId = (unsigned_short)lVar9;
    apNodesLeft[lVar9] = (CHuffmanConstructNode *)(auStack_82e + lVar7);
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + 8;
  } while (lVar9 != 0x101);
  lVar8 = 0x101;
  lVar10 = 0x800;
  lVar12 = 0x101;
  lVar7 = lVar12;
  lVar9 = lVar10;
LAB_0013604b:
  do {
    if (1 < (int)lVar12) {
      lVar12 = lVar12 + -1;
      lVar13 = 0;
      bVar6 = false;
      do {
        lVar2 = *(long *)((long)apNodesLeft + lVar13);
        lVar3 = *(long *)((long)apNodesLeft + lVar13 + 8);
        if (*(int *)(lVar2 + 4) < *(int *)(lVar3 + 4)) {
          *(long *)((long)apNodesLeft + lVar13) = lVar3;
          *(long *)((long)apNodesLeft + lVar13 + 8) = lVar2;
          bVar6 = true;
        }
        lVar13 = lVar13 + 8;
      } while (lVar10 != lVar13);
      lVar10 = lVar10 + -8;
      if (bVar6) goto LAB_0013604b;
    }
    this->m_aNodes[lVar8].m_NumBits = 0;
    pCVar4 = apNodesLeft[lVar7 + -1];
    this->m_aNodes[lVar8].m_aLeafs[0] = pCVar4->m_NodeId;
    pCVar5 = apCStack_1048[lVar7];
    lVar12 = lVar7 + -1;
    this->m_aNodes[lVar8].m_aLeafs[1] = pCVar5->m_NodeId;
    pCVar5->m_NodeId = (unsigned_short)lVar8;
    pCVar5->m_Frequency = pCVar5->m_Frequency + pCVar4->m_Frequency;
    lVar8 = lVar8 + 1;
    lVar10 = lVar9 + -8;
    lVar7 = lVar12;
    lVar9 = lVar10;
    if (lVar8 == 0x201) {
      this->m_NumNodes = 0x201;
      this->m_pStartNode = this->m_aNodes + 0x200;
      apCStack_1048[1] = (CHuffmanConstructNode *)0x1360fd;
      Setbits_r(this,this->m_aNodes + 0x200,0,0);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        apCStack_1048[1] = (CHuffmanConstructNode *)&UNK_0013611f;
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void CHuffman::ConstructTree(const unsigned *pFrequencies)
{
	CHuffmanConstructNode aNodesLeftStorage[HUFFMAN_MAX_SYMBOLS];
	CHuffmanConstructNode *apNodesLeft[HUFFMAN_MAX_SYMBOLS];
	int NumNodesLeft = HUFFMAN_MAX_SYMBOLS;

	// add the symbols
	for(int i = 0; i < HUFFMAN_MAX_SYMBOLS; i++)
	{
		m_aNodes[i].m_NumBits = 0xFFFFFFFF;
		m_aNodes[i].m_Symbol = i;
		m_aNodes[i].m_aLeafs[0] = 0xffff;
		m_aNodes[i].m_aLeafs[1] = 0xffff;

		if(i == HUFFMAN_EOF_SYMBOL)
			aNodesLeftStorage[i].m_Frequency = 1;
		else
			aNodesLeftStorage[i].m_Frequency = pFrequencies[i];
		aNodesLeftStorage[i].m_NodeId = i;
		apNodesLeft[i] = &aNodesLeftStorage[i];

	}

	m_NumNodes = HUFFMAN_MAX_SYMBOLS;

	// construct the table
	while(NumNodesLeft > 1)
	{
		// we can't rely on stdlib's qsort for this, it can generate different results on different implementations
		BubbleSort(apNodesLeft, NumNodesLeft);

		m_aNodes[m_NumNodes].m_NumBits = 0;
		m_aNodes[m_NumNodes].m_aLeafs[0] = apNodesLeft[NumNodesLeft-1]->m_NodeId;
		m_aNodes[m_NumNodes].m_aLeafs[1] = apNodesLeft[NumNodesLeft-2]->m_NodeId;
		apNodesLeft[NumNodesLeft-2]->m_NodeId = m_NumNodes;
		apNodesLeft[NumNodesLeft-2]->m_Frequency = apNodesLeft[NumNodesLeft-1]->m_Frequency + apNodesLeft[NumNodesLeft-2]->m_Frequency;

		m_NumNodes++;
		NumNodesLeft--;
	}

	// set start node
	m_pStartNode = &m_aNodes[m_NumNodes-1];

	// build symbol bits
	Setbits_r(m_pStartNode, 0, 0);
}